

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pugixml.cpp
# Opt level: O2

bool pugi::impl::(anonymous_namespace)::set_value_integer<unsigned_int,char*,unsigned_long>
               (char **dest,unsigned_long *header,uintptr_t header_mask,uint value,bool negative)

{
  bool bVar1;
  long lVar2;
  uint uVar3;
  ulong uVar4;
  byte *pbVar5;
  char_t buf [64];
  
  pbVar5 = (byte *)(buf + 0x3f);
  uVar4 = (ulong)(uint)-(int)header_mask;
  if (value == 0) {
    uVar4 = header_mask & 0xffffffff;
  }
  lVar2 = (ulong)(value + 1 & 1) - 1;
  do {
    uVar3 = (uint)uVar4;
    *pbVar5 = (byte)(uVar4 % 10) | 0x30;
    pbVar5 = pbVar5 + -1;
    lVar2 = lVar2 + -1;
    uVar4 = uVar4 / 10;
  } while (9 < uVar3);
  if (buf <= pbVar5) {
    *pbVar5 = 0x2d;
    bVar1 = strcpy_insitu<char*,unsigned_long>
                      (dest,header,0x10,(char_t *)(pbVar5 + (byte)((byte)value ^ 1)),-lVar2);
    return bVar1;
  }
  __assert_fail("result >= begin",
                "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/external/pugixml/pugixml.cpp"
                ,0x1231,
                "char_t *pugi::impl::(anonymous namespace)::integer_to_string(char_t *, char_t *, U, bool) [U = unsigned int]"
               );
}

Assistant:

PUGI__FN bool set_value_integer(String& dest, Header& header, uintptr_t header_mask, U value, bool negative)
	{
		char_t buf[64];
		char_t* end = buf + sizeof(buf) / sizeof(buf[0]);
		char_t* begin = integer_to_string(buf, end, value, negative);

		return strcpy_insitu(dest, header, header_mask, begin, end - begin);
	}